

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

void text_out_to_screen(uint8_t a,char *str)

{
  wchar_t wVar1;
  wchar_t local_184c;
  wchar_t cv [256];
  wchar_t av [256];
  wchar_t local_1040;
  wchar_t n;
  wchar_t i;
  wchar_t ch;
  wchar_t buf [1024];
  wchar_t *s;
  int local_28;
  wchar_t wrap;
  wchar_t h;
  wchar_t wid;
  wchar_t y;
  wchar_t x;
  char *str_local;
  uint8_t a_local;
  
  _y = str;
  str_local._7_1_ = a;
  Term_get_size(&wrap,&local_28);
  Term_locate(&wid,&h);
  text_mbstowcs(&i,_y,L'Ѐ');
  if ((text_out_wrap < L'\x01') || (wrap <= text_out_wrap)) {
    s._4_4_ = wrap;
  }
  else {
    s._4_4_ = text_out_wrap;
  }
  for (buf._4088_8_ = &i; *(int *)buf._4088_8_ != 0; buf._4088_8_ = buf._4088_8_ + 4) {
    if (*(int *)buf._4088_8_ == 10) {
      wid = text_out_indent;
      h = h + L'\x01';
      Term_erase(text_out_indent,h,L'ÿ');
      wid = text_out_pad + wid;
      Term_gotoxy(wid,h);
    }
    else {
      wVar1 = text_iswprint(*(wint_t *)buf._4088_8_);
      if (wVar1 == L'\0') {
        local_184c = L' ';
      }
      else {
        local_184c = *(wchar_t *)buf._4088_8_;
      }
      if ((s._4_4_ + L'\xffffffff' <= wid) && (local_184c != L' ')) {
        av[0xff] = L'\0';
        if (wid < s._4_4_) {
          local_1040 = s._4_4_ + L'\xfffffffe';
          while ((L'\xffffffff' < local_1040 &&
                 (Term_what(local_1040,h,cv + (long)local_1040 + 0xfe,cv + (long)local_1040 + -2),
                 cv[(long)local_1040 + -2] != L' '))) {
            av[0xff] = local_1040;
            local_1040 = local_1040 + L'\xffffffff';
          }
        }
        if (av[0xff] == L'\0') {
          av[0xff] = s._4_4_;
        }
        Term_erase(av[0xff],h,L'ÿ');
        wid = text_out_indent;
        h = h + L'\x01';
        Term_erase(text_out_indent,h,L'ÿ');
        wid = text_out_pad + wid;
        Term_gotoxy(wid,h);
        for (local_1040 = av[0xff]; local_1040 < s._4_4_ + L'\xffffffff';
            local_1040 = local_1040 + L'\x01') {
          Term_addch(cv[(long)local_1040 + 0xfe],cv[(long)local_1040 + -2]);
          wid = wid + L'\x01';
          if (s._4_4_ < wid) {
            wid = s._4_4_;
          }
        }
      }
      Term_addch((uint)str_local._7_1_,local_184c);
      wid = wid + L'\x01';
      if (s._4_4_ < wid) {
        wid = s._4_4_;
      }
    }
  }
  return;
}

Assistant:

void text_out_to_screen(uint8_t a, const char *str)
{
	int x, y;

	int wid, h;

	int wrap;

	const wchar_t *s;
	wchar_t buf[1024];

	/* Obtain the size */
	(void)Term_get_size(&wid, &h);

	/* Obtain the cursor */
	(void)Term_locate(&x, &y);

	/* Copy to a rewriteable string */
	text_mbstowcs(buf, str, 1024);
	
	/* Use special wrapping boundary? */
	if ((text_out_wrap > 0) && (text_out_wrap < wid))
		wrap = text_out_wrap;
	else
		wrap = wid;

	/* Process the string */
	for (s = buf; *s; s++) {
		wchar_t ch;

		/* Force wrap */
		if (*s == L'\n') {
			/* Wrap */
			x = text_out_indent;
			y++;

			/* Clear line, move cursor */
			Term_erase(x, y, 255);

			x += text_out_pad;
			Term_gotoxy(x, y);

			continue;
		}

		/* Clean up the char */
		ch = (text_iswprint(*s) ? *s : L' ');

		/* Wrap words as needed */
		if ((x >= wrap - 1) && (ch != L' ')) {
			int i, n = 0;

			int av[256];
			wchar_t cv[256];

			/* Wrap word */
			if (x < wrap) {
				/* Scan existing text */
				for (i = wrap - 2; i >= 0; i--) {
					/* Grab existing attr/char */
					Term_what(i, y, &av[i], &cv[i]);

					/* Break on space */
					if (cv[i] == L' ') break;

					/* Track current word */
					n = i;
				}
			}

			/* Special case */
			if (n == 0) n = wrap;

			/* Clear line */
			Term_erase(n, y, 255);

			/* Wrap */
			x = text_out_indent;
			y++;

			/* Clear line, move cursor */
			Term_erase(x, y, 255);

			x += text_out_pad;
			Term_gotoxy(x, y);

			/* Wrap the word (if any) */
			for (i = n; i < wrap - 1; i++) {
				/* Dump */
				Term_addch(av[i], cv[i]);

				/* Advance (no wrap) */
				if (++x > wrap) x = wrap;
			}
		}

		/* Dump */
		Term_addch(a, ch);

		/* Advance */
		if (++x > wrap) x = wrap;
	}
}